

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O3

Result * CoreML::Result::featureTypeInvariantError
                   (Result *__return_storage_ptr__,
                   vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *allowed,
                   FeatureType *actual)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Result *pRVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  stringstream ss;
  string local_1e0;
  Result *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  Result(__return_storage_ptr__);
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"Feature type invariant violation. Expected feature type ",0x38);
  FeatureType::toString_abi_cxx11_(&local_1e0,actual);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," to be one of: ",0xf);
  paVar1 = &local_1e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  lVar6 = *(long *)allowed;
  if (*(long *)(allowed + 8) != lVar6) {
    lVar5 = 0;
    uVar7 = 0;
    do {
      FeatureType::toString_abi_cxx11_(&local_1e0,(FeatureType *)(lVar6 + lVar5));
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      lVar6 = *(long *)allowed;
      uVar4 = *(long *)(allowed + 8) - lVar6 >> 4;
      if (uVar7 != uVar4 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        lVar6 = *(long *)allowed;
        uVar4 = *(long *)(allowed + 8) - lVar6 >> 4;
      }
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar7 < uVar4);
  }
  std::__cxx11::stringbuf::str();
  pRVar2 = local_1c0;
  std::__cxx11::string::operator=((string *)&local_1c0->m_message,(string *)&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  pRVar2->m_type = FEATURE_TYPE_INVARIANT_VIOLATION;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pRVar2;
}

Assistant:

Result Result::featureTypeInvariantError(
      const std::vector<FeatureType>& allowed,
      const FeatureType& actual) {

    Result out;
    std::stringstream ss;
    ss << "Feature type invariant violation. Expected feature type ";
    ss << actual.toString() << " to be one of: ";
    for (size_t i=0; i<allowed.size(); i++) {
      ss << allowed[i].toString();
      if (i != allowed.size() - 1) {
        ss << ", ";
      }
    }
    out.m_message = ss.str();
    out.m_type = ResultType::FEATURE_TYPE_INVARIANT_VIOLATION;
    return out;
  }